

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

void __thiscall backward::ResolvedTrace::ResolvedTrace(ResolvedTrace *this,Trace *mini_trace)

{
  size_t sVar1;
  
  sVar1 = mini_trace->idx;
  (this->super_Trace).addr = mini_trace->addr;
  (this->super_Trace).idx = sVar1;
  (this->object_filename)._M_dataplus._M_p = (pointer)&(this->object_filename).field_2;
  (this->object_filename)._M_string_length = 0;
  (this->object_filename).field_2._M_local_buf[0] = '\0';
  (this->object_function)._M_dataplus._M_p = (pointer)&(this->object_function).field_2;
  (this->object_function)._M_string_length = 0;
  (this->object_function).field_2._M_local_buf[0] = '\0';
  SourceLoc::SourceLoc(&this->source);
  (this->inliners).
  super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inliners).
  super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inliners).
  super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ResolvedTrace(const Trace &mini_trace) : Trace(mini_trace) {}